

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O3

cueify_msf_t cueify_full_toc_get_session_length(cueify_full_toc *t,uint8_t session)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  cueify_full_toc_private *toc;
  bool bVar9;
  
  if (((t == (cueify_full_toc *)0x0) || (session < *(byte *)t)) ||
     (*(byte *)((long)t + 1) < session)) {
    bVar4 = 0;
    bVar6 = 0;
    bVar5 = 0;
  }
  else {
    lVar8 = (ulong)session * 0x20 + (ulong)session;
    bVar7 = *(byte *)((long)t + lVar8 + 0x38c);
    bVar5 = *(byte *)((long)t + lVar8 + 0x38d);
    lVar3 = (ulong)*(byte *)((long)t + lVar8 + 0x388) * 9;
    bVar1 = *(byte *)((long)t + lVar3 + 0xb);
    bVar4 = (*(char *)((long)t + lVar8 + 0x38b) - *(char *)((long)t + lVar3 + 10)) - (bVar7 < bVar1)
    ;
    bVar2 = *(byte *)((long)t + lVar3 + 0xc);
    bVar6 = bVar7 + 0x3c;
    if (bVar1 <= bVar7) {
      bVar6 = bVar7;
    }
    bVar6 = bVar6 - bVar1;
    if (bVar5 < bVar2) {
      bVar4 = bVar4 - (bVar6 == 0);
      bVar9 = bVar6 != 0;
      bVar7 = bVar6 - 1;
      bVar6 = 0x3b;
      if (bVar9) {
        bVar6 = bVar7;
      }
      bVar5 = bVar5 + 0x4b;
    }
    bVar5 = bVar5 - bVar2;
  }
  return (cueify_msf_t)((uint3)bVar4 | (uint3)bVar6 << 8 | (uint3)bVar5 << 0x10);
}

Assistant:

cueify_msf_t cueify_full_toc_get_session_length(cueify_full_toc *t,
						uint8_t session) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;
    cueify_msf_t start, diff;

    diff.min = 0;
    diff.sec = 0;
    diff.frm = 0;

    if (toc == NULL) {
	return diff;
    } else if (session >= toc->first_session_number &&
	       session <= toc->last_session_number) {
	diff = toc->sessions[session].leadout;
	start = toc->tracks[toc->sessions[session].first_track_number].offset;
	diff.min -= start.min;
	if (diff.sec < start.sec) {
	    diff.sec += 60;
	    diff.min--;
	}
	diff.sec -= start.sec;
	if (diff.frm < start.frm) {
	    diff.frm += 75;
	    if (diff.sec == 0) {
		diff.sec += 60;
		diff.min--;
	    }
	    diff.sec--;
	}
	diff.frm -= start.frm;
	return diff;
    } else {
	return diff;
    }
}